

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# architecture.cc
# Opt level: O3

void __thiscall Architecture::saveXml(Architecture *this,ostream *s)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  char local_41;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<save_state",0xb);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"loadersymbols","");
  bVar1 = this->loadersymbols_parsed;
  local_41 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_41,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"",2);
  pcVar4 = "false";
  if (bVar1 != false) {
    pcVar4 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,pcVar4,(ulong)bVar1 ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\"",1);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,">\n",2);
  TypeFactory::saveXml(this->types,s);
  Database::saveXml(this->symboltab,s);
  (*this->context->_vptr_ContextDatabase[0xf])(this->context,s);
  (*this->commentdb->_vptr_CommentDatabase[9])(this->commentdb,s);
  iVar2 = (*this->cpool->_vptr_ConstantPool[4])();
  if ((char)iVar2 == '\0') {
    (*this->cpool->_vptr_ConstantPool[6])(this->cpool,s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"</save_state>\n",0xe);
  return;
}

Assistant:

void Architecture::saveXml(ostream &s) const

{
  s << "<save_state";
  a_v_b(s,"loadersymbols",loadersymbols_parsed);
  s << ">\n";
  types->saveXml(s);
  symboltab->saveXml(s);
  context->saveXml(s);
  commentdb->saveXml(s);
  if (!cpool->empty())
    cpool->saveXml(s);
  s << "</save_state>\n";
}